

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

CaseBlockNode * __thiscall Parser::CaseBlock(Parser *this)

{
  int token;
  uint uVar1;
  TokenNode *this_00;
  char *lex;
  CaseBlockNode *pCVar2;
  
  token = this->tok;
  if (token != 0x25) {
    if (token == 0x1d) {
      Eat(this,0x1d);
      this_00 = (TokenNode *)operator_new(0x40);
      lex = EatOrSkip(this,0x36,caseBlockFollowSet);
      TokenNode::TokenNode(this_00,0x36,lex);
      uVar1 = lexical_analyzer_getLine();
      (*(this_00->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[2])
                (this_00,(ulong)uVar1);
      EatOrSkip(this,0x2b,caseBlockFollowSet);
      pCVar2 = CaseBlockAUX(this,this_00);
      return pCVar2;
    }
    Sync(this,token,caseBlockFollowSet);
  }
  return (CaseBlockNode *)0x0;
}

Assistant:

CaseBlockNode *Parser::CaseBlock() {
    switch (tok) {
        case CASE: {
            Eat(CASE);

            TokenNode *token = new TokenNode(NUMINT, EatOrSkip(NUMINT, caseBlockFollowSet));
            token->setLine(lexical_analyzer_getLine());

            EatOrSkip(COLON, caseBlockFollowSet);
            return CaseBlockAUX(token);
        }
        case RBRACE: {
            return nullptr;
        }
        default: {
            Sync(tok, caseBlockFollowSet);
        }
    }
    return nullptr;
}